

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

int __thiscall google::protobuf::internal::ExtensionSet::Extension::GetSize(Extension *this)

{
  CppType CVar1;
  LogMessage *pLVar2;
  LogMessage local_58;
  Voidify local_45 [20];
  byte local_31;
  LogMessage local_30;
  Voidify local_19;
  Extension *local_18;
  Extension *this_local;
  
  local_31 = 0;
  local_18 = this;
  if (((this->is_repeated ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x647,"is_repeated");
    local_31 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  }
  if ((local_31 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  CVar1 = anon_unknown_59::cpp_type(this->type);
  switch(CVar1) {
  case CPPTYPE_INT32:
    this_local._4_4_ = RepeatedField<int>::size(this->field_0);
    break;
  case CPPTYPE_INT64:
    this_local._4_4_ = RepeatedField<long>::size(this->field_0);
    break;
  case CPPTYPE_UINT32:
    this_local._4_4_ = RepeatedField<unsigned_int>::size(this->field_0);
    break;
  case CPPTYPE_UINT64:
    this_local._4_4_ = RepeatedField<unsigned_long>::size(this->field_0);
    break;
  case CPPTYPE_DOUBLE:
    this_local._4_4_ = RepeatedField<double>::size(this->field_0);
    break;
  case CPPTYPE_FLOAT:
    this_local._4_4_ = RepeatedField<float>::size(this->field_0);
    break;
  case CPPTYPE_BOOL:
    this_local._4_4_ = RepeatedField<bool>::size(this->field_0);
    break;
  case CPPTYPE_ENUM:
    this_local._4_4_ = RepeatedField<int>::size(this->field_0);
    break;
  case CPPTYPE_STRING:
    this_local._4_4_ =
         RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::size(this->field_0);
    break;
  case CPPTYPE_MESSAGE:
    this_local._4_4_ = RepeatedPtrField<google::protobuf::MessageLite>::size(this->field_0);
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x65a);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [16])"Can\'t get here.");
    absl::lts_20250127::log_internal::Voidify::operator&&(local_45,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  return this_local._4_4_;
}

Assistant:

int ExtensionSet::Extension::GetSize() const {
  ABSL_DCHECK(is_repeated);
  switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)   \
  case WireFormatLite::CPPTYPE_##UPPERCASE: \
    return ptr.repeated_##LOWERCASE##_value->size()

    HANDLE_TYPE(INT32, int32_t);
    HANDLE_TYPE(INT64, int64_t);
    HANDLE_TYPE(UINT32, uint32_t);
    HANDLE_TYPE(UINT64, uint64_t);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(ENUM, enum);
    HANDLE_TYPE(STRING, string);
    HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
  }

  ABSL_LOG(FATAL) << "Can't get here.";
  return 0;
}